

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

FT_Error FT_Set_Renderer(FT_Library library,FT_Renderer_conflict renderer,FT_UInt num_params,
                        FT_Parameter *parameters)

{
  FT_Renderer_SetModeFunc p_Var1;
  FT_Error FVar2;
  FT_ListNode node;
  bool bVar3;
  
  if (library == (FT_Library)0x0) {
    FVar2 = 0x21;
  }
  else {
    FVar2 = 6;
    if ((renderer != (FT_Renderer_conflict)0x0) &&
       (num_params == 0 || parameters != (FT_Parameter *)0x0)) {
      node = FT_List_Find(&library->renderers,renderer);
      if (node != (FT_ListNode)0x0) {
        FT_List_Up(&library->renderers,node);
        if (renderer->glyph_format == FT_GLYPH_FORMAT_OUTLINE) {
          library->cur_renderer = renderer;
        }
        p_Var1 = renderer->clazz->set_mode;
        while (bVar3 = num_params != 0, num_params = num_params - 1, bVar3) {
          FVar2 = (*p_Var1)(renderer,parameters->tag,parameters->data);
          if (FVar2 != 0) {
            return FVar2;
          }
          parameters = parameters + 1;
        }
        FVar2 = 0;
      }
    }
  }
  return FVar2;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Set_Renderer( FT_Library     library,
                   FT_Renderer    renderer,
                   FT_UInt        num_params,
                   FT_Parameter*  parameters )
  {
    FT_ListNode  node;
    FT_Error     error = FT_Err_Ok;

    FT_Renderer_SetModeFunc  set_mode;


    if ( !library )
    {
      error = FT_THROW( Invalid_Library_Handle );
      goto Exit;
    }

    if ( !renderer )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    if ( num_params > 0 && !parameters )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    node = FT_List_Find( &library->renderers, renderer );
    if ( !node )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    FT_List_Up( &library->renderers, node );

    if ( renderer->glyph_format == FT_GLYPH_FORMAT_OUTLINE )
      library->cur_renderer = renderer;

    set_mode = renderer->clazz->set_mode;

    for ( ; num_params > 0; num_params-- )
    {
      error = set_mode( renderer, parameters->tag, parameters->data );
      if ( error )
        break;
      parameters++;
    }

  Exit:
    return error;
  }